

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aigPart.c
# Opt level: O2

Vec_Ptr_t * Aig_ManPartitionSmartRegisters(Aig_Man_t *pAig,int nSuppSizeLimit,int fVerbose)

{
  int iVar1;
  int i;
  int iVar2;
  abctime aVar3;
  Vec_Ptr_t *p;
  Aig_Man_t *p_00;
  abctime aVar4;
  Vec_Ptr_t *pVVar5;
  Vec_Ptr_t *p_01;
  Vec_Ptr_t *p_02;
  Vec_Int_t *pVVar6;
  Vec_Int_t *pVVar7;
  Vec_Int_t *pVVar8;
  uint *puVar9;
  void *pvVar10;
  int iVar11;
  uint uVar12;
  char *vPartsAll;
  int iVar13;
  uint uVar14;
  
  aVar3 = Abc_Clock();
  p_00 = pAig;
  p = Aig_ManSupportsRegisters(pAig);
  iVar2 = p->nSize;
  if (iVar2 == pAig->nRegs) {
    iVar11 = 0;
    iVar13 = 0;
    if (0 < iVar2) {
      iVar13 = iVar2;
    }
    for (; iVar1 = (int)p_00, iVar13 != iVar11; iVar11 = iVar11 + 1) {
      p_00 = (Aig_Man_t *)Vec_PtrEntry(p,iVar11);
      Vec_IntPush((Vec_Int_t *)p_00,iVar11);
    }
    if (fVerbose != 0) {
      Abc_Print(iVar1,"%s =","Supps");
      aVar4 = Abc_Clock();
      Abc_Print(iVar1,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
    }
    pVVar5 = Vec_PtrAlloc(1000);
    aVar3 = Abc_Clock();
    p_01 = Vec_PtrAlloc(0x100);
    p_02 = Vec_PtrAlloc(0x100);
    vPartsAll = (char *)0x0;
    while (iVar11 = (int)vPartsAll, iVar13 != iVar11) {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p,iVar11);
      iVar1 = Vec_IntPop(pVVar6);
      i = Aig_ManPartitionSmartFindPart(p_02,(Vec_Ptr_t *)vPartsAll,pVVar5,nSuppSizeLimit,pVVar6);
      if (i == -1) {
        pVVar7 = Vec_IntAlloc(0x20);
        Vec_IntPush(pVVar7,iVar1);
        pVVar8 = Vec_IntDup(pVVar6);
        Vec_PtrPush(p_01,pVVar7);
        Vec_PtrPush(p_02,pVVar8);
        puVar9 = Aig_ManSuppCharStart(pVVar6,iVar2);
        Vec_PtrPush(pVVar5,puVar9);
      }
      else {
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_01,i);
        Vec_IntPush(pVVar7,iVar1);
        pVVar7 = (Vec_Int_t *)Vec_PtrEntry(p_02,i);
        pVVar8 = Vec_IntTwoMerge(pVVar7,pVVar6);
        Vec_IntFree(pVVar7);
        Vec_PtrWriteEntry(p_02,i,pVVar8);
        puVar9 = (uint *)Vec_PtrEntry(pVVar5,i);
        Aig_ManSuppCharAdd(puVar9,pVVar6,iVar2);
      }
      vPartsAll = (char *)(ulong)(iVar11 + 1);
    }
    uVar14 = pVVar5->nSize;
    uVar12 = 0;
    if ((int)uVar14 < 1) {
      uVar14 = 0;
      uVar12 = 0;
    }
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      vPartsAll = (char *)(ulong)uVar12;
      pvVar10 = Vec_PtrEntry(pVVar5,uVar12);
      free(pvVar10);
    }
    Vec_PtrFree(pVVar5);
    iVar2 = (int)pVVar5;
    if (fVerbose != 0) {
      Abc_Print(iVar2,"%s =","Parts");
      aVar4 = Abc_Clock();
      vPartsAll = "%9.2f sec\n";
      Abc_Print(iVar2,"%9.2f sec\n",(double)(aVar4 - aVar3) / 1000000.0);
    }
    Abc_Clock();
    uVar14 = p_02->nSize;
    uVar12 = 0;
    if ((int)uVar14 < 1) {
      uVar14 = 0;
    }
    for (; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_02,uVar12);
      vPartsAll = (char *)(ulong)uVar12;
      Vec_IntPush(pVVar6,uVar12);
    }
    Vec_VecSort((Vec_Vec_t *)p_02,(int)vPartsAll);
    pVVar5 = Vec_PtrAlloc(0x100);
    for (uVar12 = 0; uVar14 != uVar12; uVar12 = uVar12 + 1) {
      pVVar6 = (Vec_Int_t *)Vec_PtrEntry(p_02,uVar12);
      iVar2 = Vec_IntPop(pVVar6);
      pvVar10 = Vec_PtrEntry(p_01,iVar2);
      Vec_PtrPush(pVVar5,pvVar10);
    }
    Vec_PtrFree(p_01);
    Aig_ManPartitionCompact(pVVar5,p_02,nSuppSizeLimit);
    if (fVerbose != 0) {
      printf("Created %d partitions.\n",(ulong)(uint)pVVar5->nSize);
    }
    Vec_VecFree((Vec_Vec_t *)p);
    Vec_VecFree((Vec_Vec_t *)p_02);
    return pVVar5;
  }
  __assert_fail("Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/aig/aigPart.c"
                ,0x336,"Vec_Ptr_t *Aig_ManPartitionSmartRegisters(Aig_Man_t *, int, int)");
}

Assistant:

Vec_Ptr_t * Aig_ManPartitionSmartRegisters( Aig_Man_t * pAig, int nSuppSizeLimit, int fVerbose )
{
    Vec_Ptr_t * vPartSuppsBit;
    Vec_Ptr_t * vSupports, * vPartsAll, * vPartsAll2, * vPartSuppsAll;
    Vec_Int_t * vOne, * vPart, * vPartSupp, * vTemp;
    int i, iPart, iOut;
    abctime clk;

    // add output number to each
clk = Abc_Clock();
    vSupports = Aig_ManSupportsRegisters( pAig );
    assert( Vec_PtrSize(vSupports) == Aig_ManRegNum(pAig) );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
        Vec_IntPush( vOne, i );
if ( fVerbose )
{
ABC_PRT( "Supps", Abc_Clock() - clk );
}

    // start char-based support representation
    vPartSuppsBit = Vec_PtrAlloc( 1000 );

    // create partitions
clk = Abc_Clock();
    vPartsAll = Vec_PtrAlloc( 256 );
    vPartSuppsAll = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vSupports, vOne, i )
    {
        // get the output number
        iOut = Vec_IntPop(vOne);
        // find closely matching part
        iPart = Aig_ManPartitionSmartFindPart( vPartSuppsAll, vPartsAll, vPartSuppsBit, nSuppSizeLimit, vOne );
        if ( iPart == -1 )
        {
            // create new partition
            vPart = Vec_IntAlloc( 32 );
            Vec_IntPush( vPart, iOut );
            // create new partition support
            vPartSupp = Vec_IntDup( vOne );
            // add this partition and its support
            Vec_PtrPush( vPartsAll, vPart );
            Vec_PtrPush( vPartSuppsAll, vPartSupp );

            Vec_PtrPush( vPartSuppsBit, Aig_ManSuppCharStart(vOne, Vec_PtrSize(vSupports)) );
        }
        else
        {
            // add output to this partition
            vPart = (Vec_Int_t *)Vec_PtrEntry( vPartsAll, iPart );
            Vec_IntPush( vPart, iOut );
            // merge supports
            vPartSupp = (Vec_Int_t *)Vec_PtrEntry( vPartSuppsAll, iPart );
            vPartSupp = Vec_IntTwoMerge( vTemp = vPartSupp, vOne );
            Vec_IntFree( vTemp );
            // reinsert new support
            Vec_PtrWriteEntry( vPartSuppsAll, iPart, vPartSupp );

            Aig_ManSuppCharAdd( (unsigned *)Vec_PtrEntry(vPartSuppsBit, iPart), vOne, Vec_PtrSize(vSupports) );
        }
    }

    // stop char-based support representation
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsBit, vTemp, i )
        ABC_FREE( vTemp );
    Vec_PtrFree( vPartSuppsBit );

//printf( "\n" );
if ( fVerbose )
{
ABC_PRT( "Parts", Abc_Clock() - clk );
}

clk = Abc_Clock();
    // reorder partitions in the decreasing order of support sizes
    // remember partition number in each partition support
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_IntPush( vOne, i );
    // sort the supports in the decreasing order
    Vec_VecSort( (Vec_Vec_t *)vPartSuppsAll, 1 );
    // reproduce partitions
    vPartsAll2 = Vec_PtrAlloc( 256 );
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
        Vec_PtrPush( vPartsAll2, Vec_PtrEntry(vPartsAll, Vec_IntPop(vOne)) );
    Vec_PtrFree( vPartsAll );
    vPartsAll = vPartsAll2;

    // compact small partitions
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    Aig_ManPartitionCompact( vPartsAll, vPartSuppsAll, nSuppSizeLimit );
    if ( fVerbose )
//    Aig_ManPartitionPrint( p, vPartsAll, vPartSuppsAll );
    printf( "Created %d partitions.\n", Vec_PtrSize(vPartsAll) );

if ( fVerbose )
{
//ABC_PRT( "Comps", Abc_Clock() - clk );
}

    // cleanup
    Vec_VecFree( (Vec_Vec_t *)vSupports );
//    if ( pvPartSupps == NULL )
        Vec_VecFree( (Vec_Vec_t *)vPartSuppsAll );
//    else
//        *pvPartSupps = vPartSuppsAll;

/*
    // converts from intergers to nodes
    Vec_PtrForEachEntry( Vec_Int_t *, vPartsAll, vPart, iPart )
    {
        vPartPtr = Vec_PtrAlloc( Vec_IntSize(vPart) );
        Vec_IntForEachEntry( vPart, iOut, i )
            Vec_PtrPush( vPartPtr, Aig_ManCo(p, iOut) );
        Vec_IntFree( vPart );
        Vec_PtrWriteEntry( vPartsAll, iPart, vPartPtr );
    }
*/
    return vPartsAll;
}